

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_writer.h
# Opt level: O2

OutputWriter * __thiscall
uttamarin::OutputWriter::operator<<
          (OutputWriter *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input)

{
  pointer ppbVar1;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *__range2;
  pointer ppbVar2;
  
  ppbVar1 = (this->streams_).
            super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppbVar2 = (this->streams_).
                 super__Vector_base<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppbVar2 != ppbVar1;
      ppbVar2 = ppbVar2 + 1) {
    std::operator<<((ostream *)*ppbVar2,(string *)input);
  }
  return this;
}

Assistant:

OutputWriter& OutputWriter::operator<<(T input) {
  for(auto stream : streams_){
    *stream << input;
  }
  return *this;
}